

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libquat_vec.cpp
# Opt level: O0

vec_3d operator^(vec_3d *a,vec_3d *b)

{
  vec_3d vVar1;
  vec_3d *b_local;
  vec_3d *a_local;
  vec_3d out;
  
  vVar1.z = a->x * b->y - a->y * b->x;
  vVar1.x = a->y * b->z - a->z * b->y;
  vVar1.y = a->z * b->x - a->x * b->z;
  return vVar1;
}

Assistant:

vec_3d operator^(const vec_3d &a, const vec_3d &b) {
    vec_3d out{0.f};  // better this way to avoid copying results to input
                      // vectors themselves
    out.x = a.y * b.z - a.z * b.y;
    out.y = -a.x * b.z + a.z * b.x;
    out.z = a.x * b.y - a.y * b.x;

    return out;
}